

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::MultiBind::DispatchBindImageTexturesTest::iterate(DispatchBindImageTexturesTest *this)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  GLuint j;
  int iVar4;
  GLenum GVar5;
  GLenum err;
  deUint32 err_00;
  undefined4 extraout_var;
  long lVar6;
  undefined4 extraout_var_00;
  int *piVar7;
  bool is_array;
  char *pcVar8;
  char *text;
  GLuint value;
  ulong uVar9;
  GLint max_textures;
  size_t load_position;
  int local_514;
  DispatchBindImageTexturesTest *local_510;
  size_t sum_position;
  allocator<char> local_4f9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> texture_ids;
  vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_> texture;
  char *local_4c0;
  string cs_source;
  Buffer texture_buffer;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  Buffer ssb_buffer;
  Program program;
  Functions *gl;
  
  local_510 = this;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar4);
  max_textures = 0;
  local_514 = 0;
  (*gl->getIntegerv)(0x8f38,&max_textures);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xf84);
  texture.
  super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  texture.
  super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  texture.
  super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  texture_buffer.m_id = 0xffffffff;
  texture_buffer.m_context = (Context *)0x0;
  texture_buffer.m_target = 0x8892;
  std::vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>::resize
            (&texture,(long)max_textures);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&texture_ids,(long)max_textures);
  iVar4 = local_514;
  if (0 < max_textures) {
    uVar9 = 0;
    do {
      GVar5 = 0xde1;
      if (uVar9 < 0xb) {
        GVar5 = (&s_texture_infos)[uVar9 * 4];
      }
      lVar6 = 0;
      do {
        value = (GLuint)uVar9;
        (&program.m_id)[lVar6] = value;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0xd8);
      iVar4 = iVar4 + value;
      if (GVar5 == 0x8c2a) {
        MultiBind::Buffer::InitData
                  (&texture_buffer,(local_510->super_TestCase).m_context,0x8c2a,0x88ea,0x360,
                   &program);
        MultiBind::Texture::InitBuffer
                  (texture.
                   super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar9,
                   (local_510->super_TestCase).m_context,0x8236,texture_buffer.m_id);
      }
      else {
        if (GVar5 == 0x9100) {
          is_array = false;
        }
        else {
          if (GVar5 != 0x9102) {
            MultiBind::Texture::InitStorage
                      (texture.
                       super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar9,
                       (local_510->super_TestCase).m_context,GVar5,1,0x8236,6,6,6,false);
            (*gl->bindTexture)(GVar5,texture.
                                     super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar9].m_id);
            err = (*gl->getError)();
            glu::checkError(err,"BindTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                            ,0x415);
            MultiBind::Texture::SubImage(gl,GVar5,0,0,0,0,6,6,6,0x8d94,0x1405,&program);
            goto LAB_008cf2c5;
          }
          is_array = true;
        }
        MultiBind::Texture::InitStorage
                  (texture.
                   super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar9,
                   (local_510->super_TestCase).m_context,GVar5,1,0x8236,6,6,6,false);
        fillMSTexture((local_510->super_TestCase).m_context,
                      texture.
                      super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar9].m_id,value,is_array);
      }
LAB_008cf2c5:
      (*gl->bindTexture)(GVar5,0);
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"BindTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                      ,0x415);
      texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar9] =
           texture.
           super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar9].m_id;
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)max_textures);
  }
  local_514 = iVar4;
  (*gl->bindImageTextures)
            (0,max_textures,
             texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"BindImageTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xfbe);
  ssb_buffer.m_id = 0xffffffff;
  ssb_buffer.m_context = (Context *)0x0;
  ssb_buffer.m_target = 0x8892;
  MultiBind::Buffer::InitData
            (&ssb_buffer,(local_510->super_TestCase).m_context,0x90d2,0x88ea,4,(GLvoid *)0x0);
  MultiBind::Buffer::BindBase(&ssb_buffer,0);
  load_position = 0;
  sum_position = 0;
  cs_source._M_dataplus._M_p = (pointer)&cs_source.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&cs_source,
             "#version 440 core\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n\nIMAGE_LIST\nlayout (std140, binding = 0) buffer SSB {\n    uint sum;\n} ssb;\n\nvoid main()\n{\n    uvec4 sum = SUM_LIST;\n    ssb.sum = sum.r\n;}\n\n"
             ,"");
  if (0 < max_textures) {
    lVar6 = 0;
    uVar9 = 0;
    do {
      sVar3 = sum_position;
      sVar1 = load_position;
      sprintf((char *)&program,"%d",uVar9 & 0xffffffff);
      local_4c0 = "ivec2(0, 0)";
      text = "uimage2D";
      pcVar8 = "imageLoad(iXXX, COORDS)";
      if (uVar9 < 0xb) {
        local_4c0 = (char *)((long)&
                                   _ZZN6gl4cts9MultiBind29DispatchBindImageTexturesTest7iterateEvE11coordinates_rel
                            + (long)*(int *)((long)&
                                                  _ZZN6gl4cts9MultiBind29DispatchBindImageTexturesTest7iterateEvE11coordinates_rel
                                            + lVar6));
        text = (char *)((long)&
                              _ZZN6gl4cts9MultiBind29DispatchBindImageTexturesTest7iterateEvE6images_rel
                       + (long)*(int *)((long)&
                                              _ZZN6gl4cts9MultiBind29DispatchBindImageTexturesTest7iterateEvE6images_rel
                                       + lVar6));
        pcVar8 = (char *)((long)&
                                _ZZN6gl4cts9MultiBind29DispatchBindImageTexturesTest7iterateEvE7loading_rel
                         + (long)*(int *)((long)&
                                                _ZZN6gl4cts9MultiBind29DispatchBindImageTexturesTest7iterateEvE7loading_rel
                                         + lVar6));
      }
      replaceToken("IMAGE_LIST",&load_position,"IMAGE\nIMAGE_LIST",&cs_source);
      load_position = sVar1;
      replaceToken("IMAGE",&load_position,
                   "layout (location = XXX, r32ui) readonly uniform IMAGE iXXX;",&cs_source);
      load_position = sVar1;
      replaceToken("XXX",&load_position,(GLchar *)&program,&cs_source);
      replaceToken("IMAGE",&load_position,text,&cs_source);
      replaceToken("XXX",&load_position,(GLchar *)&program,&cs_source);
      replaceToken("SUM_LIST",&sum_position,"LOADING + SUM_LIST",&cs_source);
      sum_position = sVar3;
      replaceToken("LOADING",&sum_position,pcVar8,&cs_source);
      sum_position = sVar3;
      replaceToken("XXX",&sum_position,(GLchar *)&program,&cs_source);
      replaceToken("COORDS",&sum_position,local_4c0,&cs_source);
      uVar9 = uVar9 + 1;
      lVar6 = lVar6 + 4;
    } while ((long)uVar9 < (long)max_textures);
  }
  replaceToken(" + SUM_LIST",&sum_position,glcts::fixed_sample_locations_values + 1,&cs_source);
  replaceToken("IMAGE_LIST",&load_position,glcts::fixed_sample_locations_values + 1,&cs_source);
  program.m_compute.m_context = (local_510->super_TestCase).m_context;
  program.m_id = 0;
  program.m_compute.m_id = 0;
  program.m_fragment.m_id = 0;
  program.m_geometry.m_id = 0;
  program.m_tess_ctrl.m_id = 0;
  program.m_tess_eval.m_id = 0;
  program.m_vertex.m_id = 0;
  program.m_fragment.m_context = program.m_compute.m_context;
  program.m_geometry.m_context = program.m_compute.m_context;
  program.m_tess_ctrl.m_context = program.m_compute.m_context;
  program.m_tess_eval.m_context = program.m_compute.m_context;
  program.m_vertex.m_context = program.m_compute.m_context;
  program.m_context = program.m_compute.m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,cs_source._M_dataplus._M_p,&local_4f9);
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,0x1b32ab9);
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,0x1b32ab9);
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,0x1b32ab9);
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,0x1b32ab9);
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,0x1b32ab9);
  MultiBind::Program::Init
            (&program,&local_3d0,&local_410,&local_430,&local_450,&local_470,&local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  iVar4 = (*(program.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar4) + 0x1680))(program.m_id);
  err_00 = (**(code **)(CONCAT44(extraout_var_00,iVar4) + 0x800))();
  glu::checkError(err_00,"UseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x330);
  if (0 < max_textures) {
    iVar4 = 0;
    do {
      (*gl->uniform1i)(iVar4,iVar4);
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"Uniform1i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                      ,0x1007);
      iVar4 = iVar4 + 1;
    } while (iVar4 < max_textures);
  }
  (*gl->dispatchCompute)(1,1,1);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"DispatchCompute",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x100b);
  (*gl->memoryBarrier)(0xffffffff);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"MemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x100e);
  piVar7 = (int *)(*gl->mapBuffer)(0x90d2,35000);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x1011);
  iVar2 = local_514;
  iVar4 = *piVar7;
  (*gl->unmapBuffer)(0x90d2);
  (*gl->getError)();
  pcVar8 = "Pass";
  if (iVar4 != iVar2) {
    pcVar8 = "Fail";
  }
  tcu::TestContext::setTestResult
            (((local_510->super_TestCase).m_context)->m_testCtx,(uint)(iVar4 != iVar2),pcVar8);
  MultiBind::Program::~Program(&program);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cs_source._M_dataplus._M_p != &cs_source.field_2) {
    operator_delete(cs_source._M_dataplus._M_p,cs_source.field_2._M_allocated_capacity + 1);
  }
  MultiBind::Buffer::~Buffer(&ssb_buffer);
  MultiBind::Buffer::~Buffer(&texture_buffer);
  if (texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)texture_ids.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)texture_ids.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>::~vector
            (&texture);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult DispatchBindImageTexturesTest::iterate()
{
	static const GLchar* cs = "#version 440 core\n"
							  "\n"
							  "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
							  "\n"
							  "IMAGE_LIST\n"
							  "layout (std140, binding = 0) buffer SSB {\n"
							  "    uint sum;\n"
							  "} ssb;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    uvec4 sum = SUM_LIST;\n"
							  "    ssb.sum = sum.r\n;"
							  "}\n"
							  "\n";

	static const GLchar* image = "layout (location = XXX, r32ui) readonly uniform IMAGE iXXX;";

	static const GLchar* loading[] = {
		"imageLoad(iXXX, COORDS)", "imageLoad(iXXX, COORDS)",	"imageLoad(iXXX, COORDS)",   "imageLoad(iXXX, COORDS)",
		"imageLoad(iXXX, COORDS)", "imageLoad(iXXX, COORDS)",	"imageLoad(iXXX, COORDS)",   "imageLoad(iXXX, COORDS)",
		"imageLoad(iXXX, COORDS)", "imageLoad(iXXX, COORDS, 0)", "imageLoad(iXXX, COORDS, 0)"
	};

	static const GLchar* images[] = { "uimage1D",	 "uimage1DArray", "uimage2D",		 "uimage2DArray",
									  "uimage3D",	 "uimageBuffer",  "uimageCube",	 "uimageCubeArray",
									  "uimage2DRect", "uimage2DMS",	"uimage2DMSArray" };

	static const GLchar* coordinates[] = {
		"0",
		"ivec2(0, 0)",
		"ivec2(0, 0)",
		"ivec3(0, 0, 0)",
		"ivec3(0, 0, 0)",
		"0",
		"ivec3(0, 0, 0)",
		"ivec3(0, 0, 0)",
		"ivec2(0, 0)",
		"ivec2(0, 0)",
		"ivec3(0, 0, 0)",
	};

	static const GLuint depth  = 6;
	static const GLuint height = 6;
	static const GLuint width  = 6;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool test_result = true;

#if DEBUG_ENBALE_MESSAGE_CALLBACK
	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");
#endif /* DEBUG_ENBALE_MESSAGE_CALLBACK */

	GLint  max_textures = 0;
	GLuint sum			= 0;

	/* Get max */
	gl.getIntegerv(GL_MAX_IMAGE_UNITS, &max_textures);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	/* Textures */
	/* Storage */
	std::vector<Texture> texture;
	std::vector<GLuint>  texture_ids;
	Buffer				 texture_buffer;

	texture.resize(max_textures);
	texture_ids.resize(max_textures);

	/* Prepare */
	for (GLint i = 0; i < max_textures; ++i)
	{
		const GLenum target = getTarget(i);

		GLuint data[width * height * depth];

		for (GLuint j = 0; j < width * height * depth; ++j)
		{
			data[j] = i;
		}

		sum += i;

		bool is_array = false;

		switch (target)
		{
		case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
			is_array = true;
		/* Intended pass-through */

		case GL_TEXTURE_2D_MULTISAMPLE:
			texture[i].InitStorage(m_context, target, 1, GL_R32UI, width, height, depth);
			fillMSTexture(m_context, texture[i].m_id, i, is_array);
			break;

		case GL_TEXTURE_BUFFER:
			texture_buffer.InitData(m_context, GL_TEXTURE_BUFFER, GL_DYNAMIC_COPY, sizeof(data), data);
			texture[i].InitBuffer(m_context, GL_R32UI, texture_buffer.m_id);
			break;

		default:
			texture[i].InitStorage(m_context, target, 1, GL_R32UI, width, height, depth);
			Texture::Bind(gl, texture[i].m_id, target);
			Texture::SubImage(gl, target, 0 /* level */, 0 /* x */, 0 /* y */, 0 /* z */, width, height, depth,
							  GL_RED_INTEGER, GL_UNSIGNED_INT, &data);
			break;
		}

		/* Clean */
		Texture::Bind(gl, 0, target);

		texture_ids[i] = texture[i].m_id;
	}

	gl.bindImageTextures(0 /* first */, max_textures /* count */, &texture_ids[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTextures");

	/* SSBO */
	Buffer ssb_buffer;
	ssb_buffer.InitData(m_context, GL_SHADER_STORAGE_BUFFER, GL_DYNAMIC_COPY, sizeof(GLuint), 0 /* data */);

	ssb_buffer.BindBase(0);

	/* Prepare program */
	size_t		load_position = 0;
	size_t		sum_position  = 0;
	std::string cs_source	 = cs;
	for (GLint i = 0; i < max_textures; ++i)
	{
		size_t load_start_position = load_position;
		size_t sum_start_position  = sum_position;

		GLchar index[16];

		sprintf(index, "%d", i);

		const GLchar* coords	   = 0;
		const GLchar* image_type   = 0;
		const GLchar* loading_code = 0;

		if (i < (GLint)s_n_texture_tragets)
		{
			coords		 = coordinates[i];
			image_type   = images[i];
			loading_code = loading[i];
		}
		else
		{
			coords		 = coordinates[2]; /* vec2(0.5f, 0.5f) */
			image_type   = images[2];	  /* usampler2D */
			loading_code = loading[2];	 /* texture(sXXX, COORDS) */
		}

		/* Add entry to ubo list */
		replaceToken("IMAGE_LIST", load_position, "IMAGE\nIMAGE_LIST", cs_source);
		load_position = load_start_position;

		replaceToken("IMAGE", load_position, image, cs_source);
		load_position = load_start_position;

		replaceToken("XXX", load_position, index, cs_source);
		replaceToken("IMAGE", load_position, image_type, cs_source);
		replaceToken("XXX", load_position, index, cs_source);

		/* Add entry to sum list */
		replaceToken("SUM_LIST", sum_position, "LOADING + SUM_LIST", cs_source);
		sum_position = sum_start_position;

		replaceToken("LOADING", sum_position, loading_code, cs_source);
		sum_position = sum_start_position;

		replaceToken("XXX", sum_position, index, cs_source);
		replaceToken("COORDS", sum_position, coords, cs_source);
	}

	/* Remove token for lists */
	replaceToken(" + SUM_LIST", sum_position, "", cs_source);
	replaceToken("IMAGE_LIST", load_position, "", cs_source);

	Program program(m_context);
	program.Init(cs_source.c_str(), "" /* fs */, "" /* gs */, "" /* tcs */, "" /* tes */, "" /* vs */);

	program.Use();

	/* Set images */
	for (GLint i = 0; i < max_textures; ++i)
	{
		gl.uniform1i(i, i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");
	}

	gl.dispatchCompute(1, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute");

	gl.memoryBarrier(GL_ALL_BARRIER_BITS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");

	GLuint* result = (GLuint*)gl.mapBuffer(GL_SHADER_STORAGE_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	if (0 != memcmp(result, &sum, sizeof(sum)))
	{
		test_result = false;
	}

	gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
	gl.getError(); /* Ignore error */

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}